

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

UniformCollection *
deqp::gles31::Functional::anon_unknown_1::UniformCollection::basicStruct
          (DataType type0,DataType type1,bool containsArrays,char *nameSuffix)

{
  undefined8 name_;
  UniformCollection *this;
  StructType *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined7 in_register_00000011;
  Precision precision;
  Precision precision_00;
  VarType local_d0;
  long lStack_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  VarType local_90;
  undefined4 local_74;
  ulong local_70;
  long *local_68 [2];
  long local_58 [2];
  VarType local_48;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,containsArrays);
  this = (UniformCollection *)operator_new(0x30);
  (this->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = (ulong)type1;
  this_00 = (StructType *)operator_new(0x38);
  local_d0._0_8_ = (long)&local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"structType","");
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._0_8_ = &local_a0;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 == paVar2) {
    local_a0._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_a0._8_8_ = plVar1[3];
  }
  else {
    local_a0._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar1;
  }
  local_b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar1 + 1);
  *plVar1 = (long)paVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,(char *)local_b0._0_8_,(allocator<char> *)local_68);
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
  }
  precision = (uint)(type0 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  if (local_d0._0_8_ != (long)&local_d0 + 0x10U) {
    operator_delete((void *)local_d0._0_8_,local_d0.m_data._8_8_ + 1);
  }
  glu::VarType::VarType((VarType *)local_b0,type0,precision);
  glu::StructType::addMember(this_00,"m0",(VarType *)local_b0);
  precision_00 = (uint)(type1 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  glu::VarType::~VarType((VarType *)local_b0);
  glu::VarType::VarType((VarType *)local_b0,(DataType)local_70,precision_00);
  glu::StructType::addMember(this_00,"m1",(VarType *)local_b0);
  glu::VarType::~VarType((VarType *)local_b0);
  if ((char)local_74 != '\0') {
    glu::VarType::VarType(&local_d0,type0,precision);
    glu::VarType::VarType((VarType *)local_b0,&local_d0,3);
    glu::StructType::addMember(this_00,"m2",(VarType *)local_b0);
    glu::VarType::~VarType((VarType *)local_b0);
    glu::VarType::~VarType(&local_d0);
    glu::VarType::VarType(&local_d0,(DataType)local_70,precision_00);
    glu::VarType::VarType((VarType *)local_b0,&local_d0,3);
    glu::StructType::addMember(this_00,"m3",(VarType *)local_b0);
    glu::VarType::~VarType((VarType *)local_b0);
    glu::VarType::~VarType(&local_d0);
  }
  addStructType(this,this_00);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"u_var","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_d0.m_data._8_8_ = *plVar3;
    lStack_b8 = plVar1[3];
    local_d0._0_8_ = (long)&local_d0 + 0x10U;
  }
  else {
    local_d0.m_data._8_8_ = *plVar3;
    local_d0._0_8_ = (long *)*plVar1;
  }
  name_ = local_d0._0_8_;
  local_d0.m_data.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar1 + 1);
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  glu::VarType::VarType(&local_48,this_00);
  Uniform::Uniform((Uniform *)local_b0,(char *)name_,&local_48);
  addUniform(this,(Uniform *)local_b0);
  glu::VarType::~VarType(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_48);
  if (local_d0._0_8_ != (long)&local_d0 + 0x10U) {
    operator_delete((void *)local_d0._0_8_,local_d0.m_data._8_8_ + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return this;
}

Assistant:

static UniformCollection* basicStruct (const glu::DataType type0, const glu::DataType type1, const bool containsArrays, const char* const nameSuffix = "")
	{
		UniformCollection* const	res		= new UniformCollection;
		const glu::Precision		prec0	= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision		prec1	= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;

		StructType* const structType = new StructType((string("structType") + nameSuffix).c_str());
		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(type1, prec1));
		if (containsArrays)
		{
			structType->addMember("m2", glu::VarType(glu::VarType(type0, prec0), 3));
			structType->addMember("m3", glu::VarType(glu::VarType(type1, prec1), 3));
		}

		res->addStructType(structType);
		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}